

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesLongMessageForm.cxx
# Opt level: O1

void __thiscall
cmCursesLongMessageForm::UpdateContent(cmCursesLongMessageForm *this,string *output,string *title)

{
  int iVar1;
  
  std::__cxx11::string::_M_assign((string *)&this->Title);
  if ((output->_M_string_length != 0) && ((this->Messages)._M_string_length < 60000)) {
    std::__cxx11::string::push_back((char)&this->Messages);
    std::__cxx11::string::_M_append((char *)&this->Messages,(ulong)(output->_M_dataplus)._M_p);
    form_driver((this->super_cmCursesForm).Form,0x212);
    form_driver((this->super_cmCursesForm).Form,0x218);
    DrawMessage(this,(output->_M_dataplus)._M_p);
  }
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
  if (_stdscr == 0) {
    iVar1 = -1;
  }
  else {
    iVar1 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,iVar1,1);
  refresh();
  return;
}

Assistant:

void cmCursesLongMessageForm::UpdateContent(std::string const& output,
                                            std::string const& title)
{
  this->Title = title;

  if (!output.empty() && this->Messages.size() < MAX_CONTENT_SIZE) {
    this->Messages.push_back('\n');
    this->Messages.append(output);
    form_driver(this->Form, REQ_NEXT_LINE);
    form_driver(this->Form, REQ_BEG_LINE);
    this->DrawMessage(output.c_str());
  }

  this->UpdateStatusBar();
  touchwin(stdscr);
  refresh();
}